

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ThreadPool::enqueue(ThreadPool *this,function<void_()> *fn)

{
  value_type *in_RSI;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (in_stack_ffffffffffffffd0,in_RSI);
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void enqueue(std::function<void()> fn) override {
    {
      std::unique_lock<std::mutex> lock(mutex_);
      jobs_.push_back(std::move(fn));
    }

    cond_.notify_one();
  }